

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *brand)

{
  uint *puVar1;
  int *__return_storage_ptr__;
  bool bVar2;
  Which WVar3;
  Which WVar4;
  Which WVar5;
  uint uVar6;
  Iterator IVar7;
  Iterator IVar8;
  Fault local_1a8;
  Fault f;
  undefined1 local_198 [7];
  bool isPointer;
  Reader type;
  Reader binding;
  undefined1 local_128 [8];
  Iterator __end4;
  undefined1 local_108 [8];
  Iterator __begin4;
  Reader *__range4;
  Reader scope;
  undefined1 local_80 [8];
  Iterator __end2;
  undefined1 local_60 [8];
  Iterator __begin2;
  Reader *__range2;
  Reader *brand_local;
  Validator *this_local;
  
  puVar1 = &__begin2.index;
  capnp::schema::Brand::Reader::getScopes((Reader *)puVar1,brand);
  IVar7 = List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader::begin((Reader *)puVar1);
  __end2._8_8_ = IVar7.container;
  __begin2.container._0_4_ = IVar7.index;
  local_60 = (undefined1  [8])__end2._8_8_;
  IVar7 = List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader::end((Reader *)puVar1);
  scope._reader._40_8_ = IVar7.container;
  __end2.container._0_4_ = IVar7.index;
  local_80 = (undefined1  [8])scope._reader._40_8_;
  do {
    bVar2 = capnp::_::
            IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
            ::operator!=((IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
                          *)local_60,
                         (IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
                          *)local_80);
    if (!bVar2) {
      return;
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
    ::operator*((Reader *)&__range4,
                (IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
                 *)local_60);
    WVar3 = capnp::schema::Brand::Scope::Reader::which((Reader *)&__range4);
    if (WVar3 == BIND) {
      puVar1 = &__begin4.index;
      capnp::schema::Brand::Scope::Reader::getBind((Reader *)puVar1,(Reader *)&__range4);
      IVar8 = List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader::begin((Reader *)puVar1);
      __end4._8_8_ = IVar8.container;
      __begin4.container._0_4_ = IVar8.index;
      local_108 = (undefined1  [8])__end4._8_8_;
      IVar8 = List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader::end((Reader *)puVar1);
      local_128 = (undefined1  [8])IVar8.container;
      __end4.container._0_4_ = IVar8.index;
      while (bVar2 = capnp::_::
                     IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
                     ::operator!=((IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
                                   *)local_108,
                                  (IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
                                   *)local_128), bVar2) {
        __return_storage_ptr__ = &type._reader.nestingLimit;
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
        ::operator*((Reader *)__return_storage_ptr__,
                    (IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
                     *)local_108);
        WVar4 = capnp::schema::Brand::Binding::Reader::which((Reader *)__return_storage_ptr__);
        if ((WVar4 != UNBOUND) && (WVar4 == TYPE)) {
          capnp::schema::Brand::Binding::Reader::getType
                    ((Reader *)local_198,(Reader *)&type._reader.nestingLimit);
          validate(this,(Reader *)local_198);
          f.exception._7_1_ = 1;
          WVar5 = capnp::schema::Type::Reader::which((Reader *)local_198);
          uVar6 = (uint)WVar5;
          if (WVar5 < TEXT) {
LAB_0082398f:
            f.exception._7_1_ = 0;
          }
          else if (uVar6 - 0xc < 3) {
LAB_00823998:
            f.exception._7_1_ = 1;
          }
          else {
            if (uVar6 == 0xf) goto LAB_0082398f;
            if (uVar6 - 0x10 < 3) goto LAB_00823998;
          }
          if ((f.exception._7_1_ & 1) == 0) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,char_const(&)[46],capnp::schema::Type::Reader&>
                      (&local_1a8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                       ,0x24a,FAILED,"isPointer",
                       "\"generic type parameter must be a pointer type\", type",
                       (char (*) [46])"generic type parameter must be a pointer type",
                       (Reader *)local_198);
            this->isValid = false;
            kj::_::Debug::Fault::~Fault(&local_1a8);
            return;
          }
        }
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
        ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
                      *)local_108);
      }
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
                  *)local_60);
  } while( true );
}

Assistant:

void validate(const schema::Brand::Reader& brand) {
    for (auto scope: brand.getScopes()) {
      switch (scope.which()) {
        case schema::Brand::Scope::BIND:
          for (auto binding: scope.getBind()) {
            switch (binding.which()) {
              case schema::Brand::Binding::UNBOUND:
                break;
              case schema::Brand::Binding::TYPE: {
                auto type = binding.getType();
                validate(type);
                bool isPointer = true;
                switch (type.which()) {
                  case schema::Type::VOID:
                  case schema::Type::BOOL:
                  case schema::Type::INT8:
                  case schema::Type::INT16:
                  case schema::Type::INT32:
                  case schema::Type::INT64:
                  case schema::Type::UINT8:
                  case schema::Type::UINT16:
                  case schema::Type::UINT32:
                  case schema::Type::UINT64:
                  case schema::Type::FLOAT32:
                  case schema::Type::FLOAT64:
                  case schema::Type::ENUM:
                    isPointer = false;
                    break;

                  case schema::Type::TEXT:
                  case schema::Type::DATA:
                  case schema::Type::ANY_POINTER:
                  case schema::Type::STRUCT:
                  case schema::Type::INTERFACE:
                  case schema::Type::LIST:
                    isPointer = true;
                    break;
                }
                VALIDATE_SCHEMA(isPointer,
                    "generic type parameter must be a pointer type", type);

                break;
              }
            }
          }
          break;
        case schema::Brand::Scope::INHERIT:
          break;
      }
    }
  }